

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O1

void __thiscall
test_matrix_dense_constructors_lambda_Test::~test_matrix_dense_constructors_lambda_Test
          (test_matrix_dense_constructors_lambda_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_dense, constructors_lambda) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix(
  [](const std::size_t row, const std::size_t column) {
    return static_cast<double>(row) * 2.0 + static_cast<double>(column);
  },
  2, 2);
  Matrix_Dense<Scalar, 2, 2> static_matrix([](const std::size_t row, const std::size_t column) {
    return static_cast<double>(row) * 2.0 + 4.0 + static_cast<double>(column);
  });
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][0], 0.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][1], 1.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][0], 2.0);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][1], 3.0);
  EXPECT_DOUBLE_EQ(static_matrix[0][0], 4.0);
  EXPECT_DOUBLE_EQ(static_matrix[0][1], 5.0);
  EXPECT_DOUBLE_EQ(static_matrix[1][0], 6.0);
  EXPECT_DOUBLE_EQ(static_matrix[1][1], 7.0);

  EXPECT_DEATH((Matrix_Dense<Scalar, 2, 2>(
               [](const std::size_t row, const std::size_t column) {
                 return static_cast<double>(row) * 2.0 + 4.0 + static_cast<double>(column);
               },
               1, 2)),
               "./*");
  EXPECT_DEATH((Matrix_Dense<Scalar, 2, 2>(
               [](const std::size_t row, const std::size_t column) {
                 return static_cast<double>(row) * 2.0 + 4.0 + static_cast<double>(column);
               },
               2, 1)),
               "./*");
}